

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentRecord.cpp
# Opt level: O3

EnvironmentRecordPtr *
KDIS::DATA_TYPE::EnvironmentRecord::FactoryDecodeEnvironmentRecord
          (EnvironmentRecordPtr *__return_storage_ptr__,KDataStream *stream)

{
  KUINT16 WP;
  GaussianPuffRecord *this;
  RefCounter *pRVar1;
  KException *pKVar2;
  KUINT32 ui32RecType;
  uint local_44;
  KString local_40;
  
  WP = KDataStream::GetCurrentWritePosition(stream);
  KDataStream::Read<unsigned_int>(stream,&local_44);
  KDataStream::SetCurrentWritePosition(stream,WP);
  this = (GaussianPuffRecord *)
         FactoryDecoderUser<KDIS::DATA_TYPE::EnvironmentRecord>::FactoryDecode(local_44,stream);
  if (this == (GaussianPuffRecord *)0x0) {
    if ((int)local_44 < 0x5000000) {
      if ((int)local_44 < 0xc0000) {
        if ((int)local_44 < 0x10000) {
          if (local_44 == 0x100) {
            this = (GaussianPuffRecord *)operator_new(0x68);
            COMBICState::COMBICState((COMBICState *)this,stream);
          }
          else {
            if (local_44 != 0x103) goto LAB_0018b49b;
            this = (GaussianPuffRecord *)operator_new(0x38);
            FlareState::FlareState((FlareState *)this,stream);
          }
        }
        else if (local_44 == 0x10000) {
          this = (GaussianPuffRecord *)operator_new(0x38);
          BoundingSphereRecord::BoundingSphereRecord((BoundingSphereRecord *)this,stream);
        }
        else {
          if (local_44 != 0xa0000) {
            if (local_44 == 0x50000) {
              pKVar2 = (KException *)__cxa_allocate_exception(0x30);
              local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_40,"FactoryDecodeEnvironmentRecord","");
              KException::KException<char_const*>(pKVar2,&local_40,9,"UniformGeometryRecordType");
              __cxa_throw(pKVar2,&KException::typeinfo,KException::~KException);
            }
LAB_0018b49b:
            pKVar2 = (KException *)__cxa_allocate_exception(0x30);
            local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,"FactoryDecodeEnvironmentRecord","");
            KException::KException<unsigned_int>(pKVar2,&local_40,9,local_44);
            __cxa_throw(pKVar2,&KException::typeinfo,KException::~KException);
          }
          this = (GaussianPuffRecord *)operator_new(0x30);
          PointRecord1::PointRecord1((PointRecord1 *)this,stream);
        }
      }
      else if ((int)local_44 < 0x100000) {
        if (local_44 == 0xc0000) {
          this = (GaussianPuffRecord *)operator_new(0x50);
          LineRecord1::LineRecord1((LineRecord1 *)this,stream);
        }
        else {
          if (local_44 != 0xd0000) goto LAB_0018b49b;
          this = (GaussianPuffRecord *)operator_new(0x38);
          SphereRecord1::SphereRecord1((SphereRecord1 *)this,stream);
        }
      }
      else if (local_44 == 0x100000) {
        this = (GaussianPuffRecord *)operator_new(0x60);
        EllipsoidRecord1::EllipsoidRecord1((EllipsoidRecord1 *)this,stream);
      }
      else if (local_44 == 0x300000) {
        this = (GaussianPuffRecord *)operator_new(0x58);
        ConeRecord1::ConeRecord1((ConeRecord1 *)this,stream);
      }
      else {
        if (local_44 != 0x500000) goto LAB_0018b49b;
        this = (GaussianPuffRecord *)operator_new(0x60);
        RectangularVolumeRecord1::RectangularVolumeRecord1((RectangularVolumeRecord1 *)this,stream);
      }
    }
    else if ((int)local_44 < 0x10000000) {
      if ((int)local_44 < 0xc000000) {
        if (local_44 == 0x5000000) {
          this = (GaussianPuffRecord *)operator_new(0x60);
          RectangularVolumeRecord3::RectangularVolumeRecord3
                    ((RectangularVolumeRecord3 *)this,stream);
        }
        else {
          if (local_44 != 0xa000000) goto LAB_0018b49b;
          this = (GaussianPuffRecord *)operator_new(0x50);
          PointRecord2::PointRecord2((PointRecord2 *)this,stream);
        }
      }
      else if (local_44 == 0xc000000) {
        this = (GaussianPuffRecord *)operator_new(0x80);
        LineRecord2::LineRecord2((LineRecord2 *)this,stream);
      }
      else {
        if (local_44 != 0xd000000) goto LAB_0018b49b;
        this = (GaussianPuffRecord *)operator_new(0x70);
        SphereRecord2::SphereRecord2((SphereRecord2 *)this,stream);
      }
    }
    else if ((int)local_44 < 0x50000000) {
      if (local_44 == 0x10000000) {
        this = (GaussianPuffRecord *)operator_new(0xb0);
        EllipsoidRecord2::EllipsoidRecord2((EllipsoidRecord2 *)this,stream);
      }
      else {
        if (local_44 != 0x30000000) goto LAB_0018b49b;
        this = (GaussianPuffRecord *)operator_new(0x90);
        ConeRecord2::ConeRecord2((ConeRecord2 *)this,stream);
      }
    }
    else if (local_44 == 0x50000000) {
      this = (GaussianPuffRecord *)operator_new(0xb0);
      RectangularVolumeRecord2::RectangularVolumeRecord2((RectangularVolumeRecord2 *)this,stream);
    }
    else if (local_44 == 0x60000000) {
      this = (GaussianPuffRecord *)operator_new(0xa0);
      GaussianPlumeRecord::GaussianPlumeRecord((GaussianPlumeRecord *)this,stream);
    }
    else {
      if (local_44 != 0x70000000) goto LAB_0018b49b;
      this = (GaussianPuffRecord *)operator_new(0xd0);
      GaussianPuffRecord::GaussianPuffRecord(this,stream);
    }
  }
  __return_storage_ptr__->_vptr_KRef_Ptr = (_func_int **)&PTR__KRef_Ptr_00225280;
  __return_storage_ptr__->m_pRef = &this->super_EnvironmentRecord;
  pRVar1 = (RefCounter *)operator_new(2);
  __return_storage_ptr__->m_piCount = pRVar1;
  *pRVar1 = 1;
  return __return_storage_ptr__;
}

Assistant:

EnvironmentRecordPtr EnvironmentRecord::FactoryDecodeEnvironmentRecord(KDataStream &stream) noexcept(false)
{
    // We now need to "peak" at the next 4 bytes to determine the Environment Record type,
    // once we have determined the type we need to return the buffers write positon as this
    // field needs to be re-read by the decode function of the derived Environment Record.
    KUINT16 ui16CurrentWritePos = stream.GetCurrentWritePosition();

    KUINT32 ui32RecType;
    stream >> ui32RecType;

    // We now know what type of record we should create, we need to reset the buffer so this value can be re-read.
    stream.SetCurrentWritePosition( ui16CurrentWritePos );

	// Check for a custom decoder, if none if found then use one of our standard data types.
	EnvironmentRecord * pRec = FactoryDecode( ui32RecType, stream );
	if( pRec )
	{
		return EnvironmentRecordPtr( pRec );
	}

    switch( ui32RecType )
    {
		//
		// Geometry Records
		//
		case PointRecord1Type:                  return new PointRecord1( stream );
		case PointRecord2Type:                  return new PointRecord2( stream );
		case LineRecord1Type:                   return new LineRecord1( stream );
		case LineRecord2Type:                   return new LineRecord2( stream );
		case BoundingSphereRecordType:          return new BoundingSphereRecord( stream );
		case SphereRecord1Type:                 return new SphereRecord1( stream );
		case SphereRecord2Type:                 return new SphereRecord2( stream );
		case EllipsoidRecord1Type:              return new EllipsoidRecord1( stream );
		case EllipsoidRecord2Type:              return new EllipsoidRecord2( stream );
		case ConeRecord1Type:                   return new ConeRecord1( stream );
		case ConeRecord2Type:                   return new ConeRecord2( stream );
		case UniformGeometryRecordType:         throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, "UniformGeometryRecordType" ); // We don't know how to decode this type.	    
		case RectangularVolumeRecord1Type:      return new RectangularVolumeRecord1( stream );
		case RectangularVolumeRecord2Type:      return new RectangularVolumeRecord2( stream );
		case GaussianPlumeRecordType:           return new GaussianPlumeRecord( stream );
		case GaussianPuffRecordType:            return new GaussianPuffRecord( stream );
		case RectangularVolumeRecord3Type:      return new RectangularVolumeRecord3( stream );

		//
		// State Records
		//
		case COMBICStateType:                   return new COMBICState( stream );
		case FlareStateType:                    return new FlareState( stream );
		default:                                throw KException( __FUNCTION__, UNSUPPORTED_DATATYPE, ui32RecType ); // We don't know how to decode this type.
    }    
}